

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

void __thiscall CStorage::LoadPaths(CStorage *this)

{
  long lVar1;
  long in_FS_OFFSET;
  char *pLineWithoutPrefix;
  char *pLine;
  IOHANDLE File;
  CStorage *this_local;
  CLineReader LineReader;
  char aBuffer [512];
  
  LineReader.m_aBuffer[0x220] = '\0';
  LineReader.m_aBuffer[0x221] = '\0';
  LineReader.m_aBuffer[0x222] = '\0';
  LineReader.m_aBuffer[0x223] = '\0';
  LineReader.m_aBuffer[0x224] = '\0';
  LineReader.m_aBuffer[0x225] = '\0';
  LineReader.m_aBuffer[0x226] = '\0';
  LineReader.m_aBuffer[0x227] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  File = io_open(pLine,pLineWithoutPrefix._4_4_);
  if (File == (IOHANDLE)0x0) {
    str_copy(pLineWithoutPrefix,(char *)this,0);
    str_append((char *)0x0,pLine,pLineWithoutPrefix._4_4_);
    File = io_open(pLine,pLineWithoutPrefix._4_4_);
    if (File == (IOHANDLE)0x0) {
      dbg_msg("storage","couldn\'t open storage.cfg");
      goto LAB_0015fc96;
    }
  }
  CLineReader::Init(&LineReader,File);
  while (pLine = CLineReader::Get((CLineReader *)pLine), pLine != (char *)0x0) {
    pLineWithoutPrefix = str_startswith(pLine,pLineWithoutPrefix);
    if ((CStorage *)pLineWithoutPrefix != (CStorage *)0x0) {
      AddPath((CStorage *)pLineWithoutPrefix,(char *)this);
    }
  }
  io_close((IOHANDLE)0x15fc74);
  if (this->m_NumPaths == 0) {
    dbg_msg("storage","no paths found in storage.cfg");
  }
LAB_0015fc96:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void LoadPaths()
	{
		// check current directory
		IOHANDLE File = io_open("storage.cfg", IOFLAG_READ | IOFLAG_SKIP_BOM);
		if(!File)
		{
			// check usable path in argv[0]
			char aBuffer[IO_MAX_PATH_LENGTH];
			str_copy(aBuffer, m_aAppDir, sizeof(aBuffer));
			str_append(aBuffer, "/storage.cfg", sizeof(aBuffer));
			File = io_open(aBuffer, IOFLAG_READ | IOFLAG_SKIP_BOM);
			if(!File)
			{
				dbg_msg("storage", "couldn't open storage.cfg");
				return;
			}
		}

		CLineReader LineReader;
		LineReader.Init(File);
		const char *pLine;
		while((pLine = LineReader.Get()))
		{
			const char *pLineWithoutPrefix = str_startswith(pLine, "add_path ");
			if(pLineWithoutPrefix)
			{
				AddPath(pLineWithoutPrefix);
			}
		}

		io_close(File);

		if(!m_NumPaths)
			dbg_msg("storage", "no paths found in storage.cfg");
	}